

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  size_type __new_size;
  
  DebugCheckInvariants(this);
  iVar1 = this->max_size_;
  if (iVar1 < new_max_size) {
    __new_size = (size_type)new_max_size;
    uVar6 = 0xffffffffffffffff;
    if (-1 < new_max_size) {
      uVar6 = __new_size * 4;
    }
    piVar4 = (int *)operator_new__(uVar6);
    piVar2 = this->sparse_to_dense_;
    if (piVar2 != (int *)0x0) {
      memmove(piVar4,piVar2,(long)iVar1 << 2);
      operator_delete__(piVar2);
    }
    this->sparse_to_dense_ = piVar4;
    std::
    vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
    ::resize(&this->dense_,__new_size);
    bVar3 = RunningOnValgrind();
    if (bVar3) {
      lVar5 = (long)this->max_size_;
      piVar2 = this->sparse_to_dense_;
      piVar4 = &(this->dense_).
                super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar5].index_;
      for (; lVar5 < (long)__new_size; lVar5 = lVar5 + 1) {
        piVar2[lVar5] = -0x54545455;
        *piVar4 = -0x54545455;
        piVar4 = piVar4 + 4;
      }
    }
  }
  this->max_size_ = new_max_size;
  if (new_max_size < this->size_) {
    this->size_ = new_max_size;
  }
  DebugCheckInvariants(this);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size_) {
    int* a = new int[new_max_size];
    if (sparse_to_dense_) {
      memmove(a, sparse_to_dense_, max_size_*sizeof a[0]);
      delete[] sparse_to_dense_;
    }
    sparse_to_dense_ = a;

    dense_.resize(new_max_size);

    // These don't need to be initialized for correctness,
    // but Valgrind will warn about use of uninitialized memory,
    // so initialize the new memory when compiling debug binaries.
    // Initialize it to garbage to detect bugs in the future.
    if (InitMemory()) {
      for (int i = max_size_; i < new_max_size; i++) {
        sparse_to_dense_[i] = 0xababababU;
        dense_[i].index_ = 0xababababU;
      }
    }
  }
  max_size_ = new_max_size;
  if (size_ > max_size_)
    size_ = max_size_;
  DebugCheckInvariants();
}